

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator __thiscall
fmt::v7::detail::float_writer<char>::prettify<fmt::v7::detail::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  counting_iterator it_1;
  counting_iterator cVar6;
  size_t sVar7;
  int num_zeros;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar9 = this->num_digits_;
  uVar8 = this->exp_;
  uVar13 = (ulong)(int)uVar9;
  uVar11 = uVar8 + uVar9;
  uVar1 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar1 & 0xff) == 1) {
    uVar8 = (this->specs_).precision - uVar9;
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar10 = 0;
    }
    bVar14 = (uVar1 >> 0x14 & 1) == 0;
    if (bVar14) {
      uVar10 = 0;
    }
    uVar12 = 1;
    if ((long)uVar13 < 1) {
      uVar12 = uVar13;
    }
    cVar6 = write_exponent<char,fmt::v7::detail::counting_iterator>
                      (uVar11 - 1,
                       (counting_iterator)
                       ((long)this->digits_ +
                       uVar10 + (it.count_ - (uVar12 + (bVar14 && (int)uVar9 < 2))) +
                                ~(ulong)this->digits_ + uVar13 + 4));
    return (counting_iterator)cVar6.count_;
  }
  if ((int)uVar8 < 0) {
    if ((int)uVar11 < 1) {
      uVar8 = -uVar11;
      if (uVar9 == 0) {
        uVar3 = (this->specs_).precision;
        uVar5 = uVar8;
        if (SBORROW4(uVar3,uVar8) != (int)(uVar3 + uVar11) < 0) {
          uVar5 = uVar3;
        }
        if (-1 < (int)uVar3) {
          uVar8 = uVar5;
        }
      }
      if (0 < (int)uVar9 && (char)((uVar1 & 0x100000) >> 0x14) == '\0') {
        do {
          if (this->digits_[(ulong)uVar9 - 1] != '0') goto LAB_00216cf0;
          bVar14 = 1 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar14);
        uVar9 = 0;
      }
LAB_00216cf0:
      if (((uVar1 & 0x100000) == 0 && uVar8 == 0) && uVar9 == 0) {
        cVar6.count_ = it.count_ + 1;
      }
      else {
        uVar13 = (ulong)(int)uVar9;
        cVar6.count_ = ((it.count_ + (~((int)uVar8 >> 0x1f) & uVar8)) -
                       ((long)uVar13 >> 0x3f & uVar13)) + uVar13 + 2;
      }
    }
    else {
      pcVar4 = this->digits_;
      uVar10 = (ulong)uVar11;
      if ((uVar1 >> 0x14 & 1) == 0) {
        if ((int)uVar11 <= (int)uVar9) {
          uVar9 = uVar11;
        }
        for (; (long)uVar10 < (long)uVar13; uVar13 = uVar13 - 1) {
          if (pcVar4[uVar13 - 1] != '0') {
            uVar9 = (uint)uVar13;
            break;
          }
        }
        uVar10 = (long)(int)uVar9 - uVar10;
        cVar6.count_ = (size_t)(pcVar4 + (((ulong)(uVar9 != uVar11) +
                                          (it.count_ - (long)pcVar4) + (long)(int)uVar9) -
                                         ((long)uVar10 >> 0x3f & uVar10)));
      }
      else {
        iVar2 = (this->specs_).precision;
        uVar8 = iVar2 - uVar9;
        cVar6.count_ = (size_t)(pcVar4 + (it.count_ - (long)pcVar4) +
                                         (uVar13 - ((long)(uVar13 - uVar10) >> 0x3f &
                                                   uVar13 - uVar10)) + 1);
        if (uVar8 != 0 && (int)uVar9 <= iVar2) {
          cVar6.count_ = (size_t)(pcVar4 + (it.count_ - (long)pcVar4) +
                                           (uVar13 - ((long)(uVar13 - uVar10) >> 0x3f &
                                                     uVar13 - uVar10)) + 1 +
                                 (~((int)uVar8 >> 0x1f) & uVar8));
        }
      }
    }
  }
  else {
    sVar7 = ((uVar8 + it.count_) - ((long)uVar13 >> 0x3f & uVar13)) + uVar13;
    iVar2 = (this->specs_).precision;
    cVar6.count_ = sVar7;
    if ((iVar2 < 0 | (byte)(uVar1 >> 0x14) & 1) == 1) {
      if (iVar2 - uVar11 == 0 || iVar2 < (int)uVar11) {
        cVar6.count_ = sVar7 + 2;
        if ((uVar1 & 0xff) == 2) {
          cVar6.count_ = sVar7 + 1;
        }
      }
      else {
        cVar6.count_ = sVar7 + 1 + (ulong)(iVar2 - uVar11);
      }
    }
  }
  return (counting_iterator)cVar6.count_;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }